

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>::Maybe
          (Maybe<capnp::Orphan<capnp::compiler::Expression>_> *this,
          Maybe<capnp::Orphan<capnp::compiler::Expression>_> *other)

{
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *other_00;
  Maybe<capnp::Orphan<capnp::compiler::Expression>_> *other_local;
  Maybe<capnp::Orphan<capnp::compiler::Expression>_> *this_local;
  
  other_00 = mv<kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>>>(&other->ptr);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
            (&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }